

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O3

void __thiscall
irr::scene::CAnimatedMeshSceneNode::~CAnimatedMeshSceneNode(CAnimatedMeshSceneNode *this)

{
  ~CAnimatedMeshSceneNode(this,&VTT);
  operator_delete(this,0x1b0);
  return;
}

Assistant:

CAnimatedMeshSceneNode::~CAnimatedMeshSceneNode()
{
	if (LoopCallBack)
		LoopCallBack->drop();
	if (Mesh)
		Mesh->drop();
}